

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O3

int32 parse_rem(char ***attrib,uint32 *tmat,uint32 *state,uint32 *n_state,uint32 n_read)

{
  uint32 uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar2 = strtok((char *)0x0," \t");
  mk_attrib_list(pcVar2);
  *attrib = mk_attrib_list::attrib_list;
  pcVar2 = strtok((char *)0x0," \t");
  uVar1 = atoi(pcVar2);
  *tmat = uVar1;
  uVar5 = (ulong)*n_state;
  uVar4 = 0;
  if (uVar5 != 0) {
    uVar3 = 0;
    do {
      pcVar2 = strtok((char *)0x0," \t");
      uVar4 = uVar3;
      if (pcVar2 == (char *)0x0) break;
      uVar1 = 0xffffffff;
      if (*pcVar2 != 'N') {
        uVar1 = atoi(pcVar2);
      }
      state[uVar3] = uVar1;
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar3);
  }
  *n_state = (uint32)uVar4;
  return 0;
}

Assistant:

static int32
parse_rem(const char ***attrib,
	  uint32 *tmat,
	  uint32 *state,
	  uint32 *n_state,
	  uint32 n_read)
{
    unsigned int max_n_state;
    uint32 i;
    char *tok;

    *attrib = mk_attrib_list(strtok(NULL, " \t"));

    *tmat = atoi(strtok(NULL, " \t"));

    max_n_state = *n_state;

    for (i = 0; (i < max_n_state) && (tok = strtok(NULL, " \t")); i++) {
	if (tok[0] != 'N')
	    state[i] = atoi(tok);
	else
	    state[i] = TYING_NON_EMITTING;
    }
    
    if (i <= max_n_state)
	*n_state = i;
    else {
	fflush(stdout);
	fprintf(stderr, "%s(%d): number of states for phone exceeds max, %d at line %d\n",
		__FILE__, __LINE__,
		max_n_state, n_read);
	fflush(stderr);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}